

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall
pbrt::BilinearPatchMesh::BilinearPatchMesh
          (BilinearPatchMesh *this,Transform *renderFromObject,bool reverseOrientation,
          vector<int,_std::allocator<int>_> *indices,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *P,
          vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *N,
          vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *UV,
          vector<int,_std::allocator<int>_> *fIndices,PiecewiseConstant2D *imageDist,Allocator alloc
          )

{
  undefined8 uVar1;
  span<const_int> buf;
  span<const_pbrt::Point3<float>_> buf_00;
  span<const_pbrt::Point2<float>_> buf_01;
  span<const_pbrt::Normal3<float>_> buf_02;
  span<const_int> buf_03;
  bool bVar2;
  size_type sVar3;
  int *piVar4;
  Tuple3<pbrt::Point3,_float> *pTVar5;
  Point3<float> *pPVar6;
  Point2<float> *pPVar7;
  iterator iVar8;
  reference pNVar9;
  Normal3<float> *pNVar10;
  char (*args_4) [16];
  vector<int,_std::allocator<int>_> *in_RCX;
  byte in_DL;
  byte *in_RDI;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *in_R8;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *in_R9;
  long *in_FS_OFFSET;
  undefined1 auVar14 [56];
  undefined1 auVar11 [64];
  undefined1 auVar13 [64];
  Point3<float> PVar15;
  Normal3<float> NVar16;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *in_stack_00000008;
  vector<int,_std::allocator<int>_> *in_stack_00000010;
  undefined8 in_stack_00000018;
  BufferCache<pbrt::Normal3<float>_> *in_stack_00000020;
  size_type vb_5;
  int va_5;
  Normal3f *n;
  iterator __end2;
  iterator __begin2;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *__range2;
  size_type vb_4;
  int va_4;
  size_type vb_3;
  int va_3;
  Point3f *p;
  iterator __end1;
  iterator __begin1;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *__range1;
  int vb_2;
  size_type va_2;
  int vb_1;
  size_type va_1;
  int vb;
  size_type va;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *in_stack_fffffffffffffd98;
  Tuple3<pbrt::Normal3,_float> *in_stack_fffffffffffffda0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffda8;
  span<const_pbrt::Normal3<float>_> *in_stack_fffffffffffffdb0;
  int line;
  char (*in_stack_fffffffffffffe20) [21];
  unsigned_long *in_stack_fffffffffffffe28;
  char (*in_stack_fffffffffffffe30) [32];
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  int iVar17;
  BufferCache<pbrt::Point3<float>_> *in_stack_fffffffffffffe40;
  Allocator in_stack_fffffffffffffe48;
  Normal3<float> *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  float fVar18;
  __normal_iterator<pbrt::Normal3<float>_*,_std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>_>
  local_140 [2];
  size_type local_130;
  int local_124;
  BufferCache<pbrt::Normal3<float>_> *local_120;
  size_type local_108;
  int local_fc;
  BufferCache<pbrt::Normal3<float>_> *local_f8;
  undefined8 local_e0;
  float in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  __normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
  local_98 [2];
  BufferCache<pbrt::Normal3<float>_> *local_88;
  int local_6c;
  ulong local_68;
  int local_5c;
  ulong local_58;
  undefined4 local_4c;
  ulong local_48;
  byte local_21;
  BufferCache<pbrt::Normal3<float>_> *local_10;
  undefined1 auVar12 [64];
  
  local_10 = in_stack_00000020;
  local_21 = in_DL & 1;
  *in_RDI = local_21;
  bVar2 = Transform::SwapsHandedness
                    ((Transform *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  in_RDI[1] = bVar2;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  *(int *)(in_RDI + 4) = (int)(sVar3 >> 2);
  sVar3 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size(in_R8);
  *(int *)(in_RDI + 8) = (int)sVar3;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  in_RDI[0x12] = 0;
  in_RDI[0x13] = 0;
  in_RDI[0x14] = 0;
  in_RDI[0x15] = 0;
  in_RDI[0x16] = 0;
  in_RDI[0x17] = 0;
  in_RDI[0x18] = 0;
  in_RDI[0x19] = 0;
  in_RDI[0x1a] = 0;
  in_RDI[0x1b] = 0;
  in_RDI[0x1c] = 0;
  in_RDI[0x1d] = 0;
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  in_RDI[0x20] = 0;
  in_RDI[0x21] = 0;
  in_RDI[0x22] = 0;
  in_RDI[0x23] = 0;
  in_RDI[0x24] = 0;
  in_RDI[0x25] = 0;
  in_RDI[0x26] = 0;
  in_RDI[0x27] = 0;
  in_RDI[0x28] = 0;
  in_RDI[0x29] = 0;
  in_RDI[0x2a] = 0;
  in_RDI[0x2b] = 0;
  in_RDI[0x2c] = 0;
  in_RDI[0x2d] = 0;
  in_RDI[0x2e] = 0;
  in_RDI[0x2f] = 0;
  in_RDI[0x30] = 0;
  in_RDI[0x31] = 0;
  in_RDI[0x32] = 0;
  in_RDI[0x33] = 0;
  in_RDI[0x34] = 0;
  in_RDI[0x35] = 0;
  in_RDI[0x36] = 0;
  in_RDI[0x37] = 0;
  *(undefined8 *)(in_RDI + 0x38) = in_stack_00000018;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  local_48 = sVar3 & 3;
  local_4c = 0;
  if (local_48 != 0) {
    LogFatal<char_const(&)[21],char_const(&)[2],char_const(&)[21],unsigned_long&,char_const(&)[2],int&>
              ((LogLevel)((ulong)in_RDI >> 0x20),(char *)in_R8,(int)((ulong)in_RCX >> 0x20),
               (char *)in_stack_00000008,(char (*) [21])in_stack_00000010,(char (*) [2])in_R9,
               in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
               (char (*) [2])in_stack_fffffffffffffe30,
               (int *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  }
  *(long *)(*in_FS_OFFSET + -0x3a0) = *(long *)(*in_FS_OFFSET + -0x3a0) + 1;
  *(long *)(*in_FS_OFFSET + -0x398) = (long)*(int *)(in_RDI + 4) + *(long *)(*in_FS_OFFSET + -0x398)
  ;
  local_58 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size(in_R8);
  local_5c = std::numeric_limits<int>::max();
  if ((ulong)(long)local_5c < local_58) {
    LogFatal<char_const(&)[9],char_const(&)[32],char_const(&)[9],unsigned_long&,char_const(&)[32],int&>
              ((LogLevel)((ulong)in_RDI >> 0x20),(char *)in_R8,(int)((ulong)in_RCX >> 0x20),
               (char *)in_stack_00000008,(char (*) [9])in_stack_00000010,(char (*) [32])in_R9,
               (char (*) [9])in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
               in_stack_fffffffffffffe30,
               (int *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  }
  local_68 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  local_6c = std::numeric_limits<int>::max();
  if ((ulong)(long)local_6c < local_68) {
    LogFatal<char_const(&)[15],char_const(&)[32],char_const(&)[15],unsigned_long&,char_const(&)[32],int&>
              ((LogLevel)((ulong)in_RDI >> 0x20),(char *)in_R8,(int)((ulong)in_RCX >> 0x20),
               (char *)in_stack_00000008,(char (*) [15])in_stack_00000010,(char (*) [32])in_R9,
               (char (*) [15])in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
               in_stack_fffffffffffffe30,
               (int *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  }
  pstd::span<const_int>::span<int>
            ((span<const_int> *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  local_88 = local_10;
  buf.n = in_stack_fffffffffffffe58;
  buf.ptr = (int *)in_stack_fffffffffffffe50;
  piVar4 = BufferCache<int>::LookupOrAdd
                     ((BufferCache<int> *)in_stack_fffffffffffffe40,buf,in_stack_fffffffffffffe48);
  *(int **)(in_RDI + 0x10) = piVar4;
  *(long *)(*in_FS_OFFSET + -0x390) = *(long *)(*in_FS_OFFSET + -0x390) + 0x40;
  local_98[0]._M_current =
       (Point3<float> *)
       std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::begin
                 ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                  in_stack_fffffffffffffd98);
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::end
            ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
             in_stack_fffffffffffffd98);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
                        *)in_stack_fffffffffffffda0,
                       (__normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
                        *)in_stack_fffffffffffffd98);
    if (!bVar2) break;
    pTVar5 = &__gnu_cxx::
              __normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
              ::operator*(local_98)->super_Tuple3<pbrt::Point3,_float>;
    auVar14 = ZEXT856(0);
    PVar15 = Transform::operator()
                       ((Transform *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                        *pTVar5);
    in_stack_ffffffffffffff28 = PVar15.super_Tuple3<pbrt::Point3,_float>.z;
    auVar11._0_8_ = PVar15.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar11._8_56_ = auVar14;
    local_e0 = vmovlpd_avx(auVar11._0_16_);
    pTVar5->x = (float)(int)local_e0;
    pTVar5->y = (float)(int)((ulong)local_e0 >> 0x20);
    pTVar5->z = in_stack_ffffffffffffff28;
    __gnu_cxx::
    __normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
    ::operator++(local_98);
  }
  pstd::span<pbrt::Point3<float>const>::span<pbrt::Point3<float>>
            ((span<const_pbrt::Point3<float>_> *)in_stack_fffffffffffffdb0,
             (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
             in_stack_fffffffffffffda8);
  local_f8 = local_10;
  buf_00.n = in_stack_fffffffffffffe58;
  buf_00.ptr = (Point3<float> *)in_stack_fffffffffffffe50;
  pPVar6 = BufferCache<pbrt::Point3<float>_>::LookupOrAdd
                     (in_stack_fffffffffffffe40,buf_00,in_stack_fffffffffffffe48);
  *(Point3<float> **)(in_RDI + 0x18) = pPVar6;
  bVar2 = std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::empty
                    ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                     in_stack_fffffffffffffdb0);
  if (!bVar2) {
    local_fc = *(int *)(in_RDI + 8);
    local_108 = std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::size
                          (in_stack_00000008);
    if ((long)local_fc != local_108) {
      LogFatal<char_const(&)[10],char_const(&)[10],char_const(&)[10],int&,char_const(&)[10],unsigned_long&>
                ((LogLevel)((ulong)in_RDI >> 0x20),(char *)in_R8,(int)((ulong)in_RCX >> 0x20),
                 (char *)in_stack_00000008,(char (*) [10])in_stack_00000010,(char (*) [10])in_R9,
                 (char (*) [10])in_stack_fffffffffffffe20,(int *)in_stack_fffffffffffffe28,
                 (char (*) [10])in_stack_fffffffffffffe30,
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    }
    pstd::span<pbrt::Point2<float>const>::span<pbrt::Point2<float>>
              ((span<const_pbrt::Point2<float>_> *)in_stack_fffffffffffffdb0,
               (vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
               in_stack_fffffffffffffda8);
    local_120 = local_10;
    buf_01.n = in_stack_fffffffffffffe58;
    buf_01.ptr = (Point2<float> *)in_stack_fffffffffffffe50;
    pPVar7 = BufferCache<pbrt::Point2<float>_>::LookupOrAdd
                       ((BufferCache<pbrt::Point2<float>_> *)in_stack_fffffffffffffe40,buf_01,
                        in_stack_fffffffffffffe48);
    *(Point2<float> **)(in_RDI + 0x28) = pPVar7;
  }
  bVar2 = std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::empty
                    ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
                     in_stack_fffffffffffffdb0);
  line = (int)((ulong)in_RCX >> 0x20);
  if (!bVar2) {
    local_124 = *(int *)(in_RDI + 8);
    local_130 = std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::size
                          (in_R9);
    if ((long)local_124 != local_130) {
      LogFatal<char_const(&)[10],char_const(&)[9],char_const(&)[10],int&,char_const(&)[9],unsigned_long&>
                ((LogLevel)((ulong)in_RDI >> 0x20),(char *)in_R8,(int)((ulong)in_RCX >> 0x20),
                 (char *)in_stack_00000008,(char (*) [10])in_stack_00000010,(char (*) [9])in_R9,
                 (char (*) [10])in_stack_fffffffffffffe20,(int *)in_stack_fffffffffffffe28,
                 (char (*) [9])in_stack_fffffffffffffe30,
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    }
    local_140[0]._M_current =
         (Normal3<float> *)
         std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::begin
                   (in_stack_fffffffffffffd98);
    iVar8 = std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::end
                      (in_stack_fffffffffffffd98);
    fVar18 = SUB84(iVar8._M_current,0);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<pbrt::Normal3<float>_*,_std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>_>
                          *)in_stack_fffffffffffffda0,
                         (__normal_iterator<pbrt::Normal3<float>_*,_std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>_>
                          *)in_stack_fffffffffffffd98);
      line = (int)((ulong)in_RCX >> 0x20);
      if (!bVar2) break;
      pNVar9 = __gnu_cxx::
               __normal_iterator<pbrt::Normal3<float>_*,_std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>_>
               ::operator*(local_140);
      auVar14 = ZEXT856(0);
      NVar16.super_Tuple3<pbrt::Normal3,_float>.z = fVar18;
      NVar16.super_Tuple3<pbrt::Normal3,_float>._0_8_ = pNVar9;
      NVar16 = Transform::operator()
                         (*(Transform **)&pNVar9->super_Tuple3<pbrt::Normal3,_float>,NVar16);
      auVar12._0_8_ = NVar16.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar12._8_56_ = auVar14;
      uVar1 = vmovlpd_avx(auVar12._0_16_);
      (pNVar9->super_Tuple3<pbrt::Normal3,_float>).x = (float)(int)uVar1;
      (pNVar9->super_Tuple3<pbrt::Normal3,_float>).y = (float)(int)((ulong)uVar1 >> 0x20);
      (pNVar9->super_Tuple3<pbrt::Normal3,_float>).z = NVar16.super_Tuple3<pbrt::Normal3,_float>.z;
      if ((local_21 & 1) != 0) {
        NVar16 = Tuple3<pbrt::Normal3,_float>::operator-(in_stack_fffffffffffffda0);
        auVar13._0_8_ = NVar16.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar13._8_56_ = auVar14;
        in_stack_fffffffffffffe58 = vmovlpd_avx(auVar13._0_16_);
        (pNVar9->super_Tuple3<pbrt::Normal3,_float>).x = (float)(int)in_stack_fffffffffffffe58;
        (pNVar9->super_Tuple3<pbrt::Normal3,_float>).y =
             (float)(int)(in_stack_fffffffffffffe58 >> 0x20);
        (pNVar9->super_Tuple3<pbrt::Normal3,_float>).z = NVar16.super_Tuple3<pbrt::Normal3,_float>.z
        ;
      }
      __gnu_cxx::
      __normal_iterator<pbrt::Normal3<float>_*,_std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>_>
      ::operator++(local_140);
    }
    pstd::span<pbrt::Normal3<float>const>::span<pbrt::Normal3<float>>
              (in_stack_fffffffffffffdb0,
               (vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
               in_stack_fffffffffffffda8);
    buf_02.n = in_stack_fffffffffffffe58;
    buf_02.ptr = in_stack_fffffffffffffe50;
    pNVar10 = BufferCache<pbrt::Normal3<float>_>::LookupOrAdd
                        (local_10,buf_02,in_stack_fffffffffffffe48);
    *(Normal3<float> **)(in_RDI + 0x20) = pNVar10;
    in_stack_fffffffffffffe40 = (BufferCache<pbrt::Point3<float>_> *)local_10;
  }
  bVar2 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0);
  if (!bVar2) {
    iVar17 = *(int *)(in_RDI + 4);
    args_4 = (char (*) [16])std::vector<int,_std::allocator<int>_>::size(in_stack_00000010);
    if ((char (*) [16])(long)iVar17 != args_4) {
      LogFatal<char_const(&)[9],char_const(&)[16],char_const(&)[9],int&,char_const(&)[16],unsigned_long&>
                ((LogLevel)((ulong)in_RDI >> 0x20),(char *)in_R8,line,(char *)in_stack_00000008,
                 (char (*) [9])in_stack_00000010,(char (*) [16])in_R9,
                 (char (*) [9])in_stack_fffffffffffffe20,(int *)in_stack_fffffffffffffe28,args_4,
                 (unsigned_long *)CONCAT44(iVar17,in_stack_fffffffffffffe38));
    }
    pstd::span<const_int>::span<int>
              ((span<const_int> *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    buf_03.n = in_stack_fffffffffffffe58;
    buf_03.ptr = (int *)in_stack_fffffffffffffe50;
    piVar4 = BufferCache<int>::LookupOrAdd
                       ((BufferCache<int> *)in_stack_fffffffffffffe40,buf_03,
                        in_stack_fffffffffffffe48);
    *(int **)(in_RDI + 0x30) = piVar4;
  }
  return;
}

Assistant:

BilinearPatchMesh::BilinearPatchMesh(const Transform &renderFromObject,
                                     bool reverseOrientation, std::vector<int> indices,
                                     std::vector<Point3f> P, std::vector<Normal3f> N,
                                     std::vector<Point2f> UV, std::vector<int> fIndices,
                                     PiecewiseConstant2D *imageDist, Allocator alloc)
    : reverseOrientation(reverseOrientation),
      transformSwapsHandedness(renderFromObject.SwapsHandedness()),
      nPatches(indices.size() / 4),
      nVertices(P.size()),
      imageDistribution(imageDist) {
    CHECK_EQ((indices.size() % 4), 0);
    ++nBilinearMeshes;
    nBlps += nPatches;

    // Make sure that we don't have too much stuff to be using integers to
    // index into things.
    CHECK_LE(P.size(), std::numeric_limits<int>::max());
    CHECK_LE(indices.size(), std::numeric_limits<int>::max());

    vertexIndices = intBufferCache->LookupOrAdd(indices, alloc);

    blpBytes += sizeof(*this);

    // Transform mesh vertices to rendering space
    for (Point3f &p : P)
        p = renderFromObject(p);
    p = point3BufferCache->LookupOrAdd(P, alloc);

    // Copy _UV_ and _N_ vertex data, if present
    if (!UV.empty()) {
        CHECK_EQ(nVertices, UV.size());
        uv = point2BufferCache->LookupOrAdd(UV, alloc);
    }
    if (!N.empty()) {
        CHECK_EQ(nVertices, N.size());
        for (Normal3f &n : N) {
            n = renderFromObject(n);
            if (reverseOrientation)
                n = -n;
        }
        n = normal3BufferCache->LookupOrAdd(N, alloc);
    }

    if (!fIndices.empty()) {
        CHECK_EQ(nPatches, fIndices.size());
        faceIndices = intBufferCache->LookupOrAdd(fIndices, alloc);
    }
}